

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.c
# Opt level: O0

gs_expr_t * gs_parse_expr_factor(gs_parser_t *parser)

{
  gs_token_t token_00;
  _Bool _Var1;
  gs_expr_t *right_00;
  gs_expr_t *right;
  gs_expr_t *pgStack_30;
  gs_binary_op_type binary_op_type;
  gs_expr_t *expr;
  gs_token_t token;
  gs_parser_t *parser_local;
  
  token.field_3 = (anon_union_8_5_f029217d_for_gs_token_3)parser;
  gs_peek((gs_token_t *)&expr,parser);
  pgStack_30 = gs_parse_expr_cast((gs_parser_t *)token.field_3.symbol);
  if ((token.field_3.symbol[0x1c] & 1U) != 0) {
    return pgStack_30;
  }
  while( true ) {
    _Var1 = gs_eat_char((gs_parser_t *)token.field_3.symbol,'*');
    if (_Var1) {
      right._4_4_ = GS_BINARY_OP_MUL;
    }
    else {
      _Var1 = gs_eat_char((gs_parser_t *)token.field_3.symbol,'/');
      if (!_Var1) {
        return pgStack_30;
      }
      right._4_4_ = GS_BINARY_OP_DIV;
    }
    right_00 = gs_parse_expr_cast((gs_parser_t *)token.field_3.symbol);
    if ((token.field_3.symbol[0x1c] & 1U) != 0) break;
    token_00.col = token.type;
    token_00._12_4_ = token.line;
    token_00._0_8_ = expr;
    token_00.field_3 = (anon_union_8_5_f029217d_for_gs_token_3)token._8_8_;
    pgStack_30 = gs_expr_binary_op_new
                           ((gs_parser_t *)token.field_3.symbol,token_00,right._4_4_,pgStack_30,
                            right_00);
  }
  return pgStack_30;
}

Assistant:

static gs_expr_t *gs_parse_expr_factor(gs_parser_t *parser) {
    gs_token_t token = gs_peek(parser);
    gs_expr_t *expr = gs_parse_expr_cast(parser);
    if (parser->error) goto cleanup;

    while (true) {
        gs_binary_op_type binary_op_type;
        if (gs_eat_char(parser, '*')) {
            binary_op_type = GS_BINARY_OP_MUL;
        }
        else if (gs_eat_char(parser, '/')) {
            binary_op_type = GS_BINARY_OP_DIV;
        }
        else {
            break;
        }

        gs_expr_t *right = gs_parse_expr_cast(parser);
        if (parser->error) goto cleanup;
        expr = gs_expr_binary_op_new(parser, token, binary_op_type, expr, right);
    }

cleanup:
    return expr;
}